

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

string * clask::camelize(string *__return_storage_ptr__,string *s)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  size_t i;
  size_type sVar4;
  
  sVar1 = s->_M_string_length;
  for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
    pcVar2 = (s->_M_dataplus)._M_p;
    if (((sVar4 == 0) || (pcVar2[sVar4 - 1] == '-')) || (pcVar2[sVar4 - 1] == ' ')) {
      iVar3 = toupper((int)pcVar2[sVar4]);
      pcVar2[sVar4] = (char)iVar3;
    }
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
  return __return_storage_ptr__;
}

Assistant:

inline std::string camelize(std::string& s) {
  auto n = s.length();
  for (size_t i = 0; i < n; i++) {
    if (i == 0 || s[i - 1] == ' ' || s[i - 1] == '-') {
      s[i] = (char) std::toupper(s[i]);
      continue;
    }
  }
  return s.substr(0, n);
}